

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_url_tests.cpp
# Opt level: O2

void __thiscall
common_url_tests::decode_internal_nulls_test::test_method(decode_internal_nulls_test *this)

{
  long lVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string file;
  string_view url_encoded;
  const_string file_00;
  string_view url_encoded_00;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  string local_b8;
  undefined1 local_98 [32];
  string result2;
  string result1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  result1._M_dataplus._M_p = (pointer)&result1.field_2;
  result1.field_2._M_allocated_capacity._4_2_ = 0;
  result1.field_2._M_allocated_capacity._0_4_ = 0x780000;
  result1._M_string_length = 5;
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/common_url_tests.cpp"
  ;
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x46;
  file.m_begin = (iterator)&local_c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d8,msg);
  result2._M_string_length = result2._M_string_length & 0xffffffffffffff00;
  result2._M_dataplus._M_p = "<W\x1b";
  result2.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  result2.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/common_url_tests.cpp"
  ;
  local_e0 = "";
  url_encoded._M_str = "%00%00x%00%00";
  url_encoded._M_len = 0xd;
  UrlDecode_abi_cxx11_((string *)local_98,url_encoded);
  pvVar2 = (iterator)0x2;
  pvVar3 = local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&result2,&local_e8,0x46,1,2,pvVar3,"UrlDecode(\"%00%00x%00%00\")",&result1,"result1");
  std::__cxx11::string::~string((string *)local_98);
  result2._M_dataplus._M_p = (pointer)&result2.field_2;
  result2.field_2._M_allocated_capacity._0_6_ = 0x636261;
  result2._M_string_length = 5;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/common_url_tests.cpp"
  ;
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  file_00.m_end = (iterator)0x48;
  file_00.m_begin = (iterator)&local_f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_108,
             msg_00);
  local_98[8] = 0;
  local_98._0_8_ = &PTR__lazy_ostream_01139f30;
  local_98._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_98._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/common_url_tests.cpp"
  ;
  local_110 = "";
  url_encoded_00._M_str = "abc%00%00";
  url_encoded_00._M_len = 9;
  UrlDecode_abi_cxx11_(&local_b8,url_encoded_00);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (local_98,&local_118,0x48,1,2,&local_b8,"UrlDecode(\"abc%00%00\")",&result2,"result2");
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&result2);
  std::__cxx11::string::~string((string *)&result1);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(decode_internal_nulls_test) {
    std::string result1{"\0\0x\0\0", 5};
    BOOST_CHECK_EQUAL(UrlDecode("%00%00x%00%00"), result1);
    std::string result2{"abc\0\0", 5};
    BOOST_CHECK_EQUAL(UrlDecode("abc%00%00"), result2);
}